

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTContext.cpp
# Opt level: O2

Symbol * __thiscall slang::ast::ASTContext::tryFillAssertionDetails(ASTContext *this)

{
  Symbol *pSVar1;
  CheckerInstanceBodySymbol *body;
  Scope *pSVar2;
  
  if (this->assertionInstance == (AssertionInstanceDetails *)0x0) {
    pSVar2 = (this->scope).ptr;
    do {
      pSVar1 = pSVar2->thisSym;
      if (pSVar1->kind == InstanceBody) {
        return pSVar1;
      }
      if (pSVar1->kind == CheckerInstanceBody) {
        this->assertionInstance = (AssertionInstanceDetails *)pSVar1[2].name._M_len;
        return pSVar1;
      }
      pSVar2 = pSVar1->parentScope;
    } while (pSVar2 != (Scope *)0x0);
  }
  return (Symbol *)0x0;
}

Assistant:

const Symbol* ASTContext::tryFillAssertionDetails() {
    if (assertionInstance)
        return nullptr;

    auto parentSym = &scope->asSymbol();
    while (true) {
        if (parentSym->kind == SymbolKind::InstanceBody)
            return parentSym;

        if (parentSym->kind == SymbolKind::CheckerInstanceBody) {
            auto& body = parentSym->as<CheckerInstanceBodySymbol>();
            assertionInstance = &body.assertionDetails;
            return parentSym;
        }

        auto nextScope = parentSym->getParentScope();
        if (!nextScope)
            break;

        parentSym = &nextScope->asSymbol();
    }

    return nullptr;
}